

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O1

int dh_derive(ptls_hpke_kem_t *kem,void *secret,ptls_iovec_t pk_s,ptls_iovec_t pk_r,ptls_iovec_t dh)

{
  size_t outlen;
  ptls_iovec_t info;
  int iVar1;
  ptls_iovec_t prk;
  ptls_buffer_t kem_context;
  uint8_t eae_prk [64];
  uint8_t kem_context_smallbuf [128];
  ptls_buffer_t local_118;
  uint8_t local_f8 [64];
  uint8_t local_b8 [136];
  
  outlen = kem->hash->digest_size;
  local_118.base = local_b8;
  local_118.off = 0;
  local_118.capacity = 0x80;
  local_118._24_8_ = local_118._24_8_ & 0xffffffffffff0000;
  iVar1 = ptls_buffer__do_pushv(&local_118,pk_s.base,pk_s.len);
  if (iVar1 == 0) {
    iVar1 = ptls_buffer__do_pushv(&local_118,pk_r.base,pk_r.len);
    if (iVar1 == 0) {
      iVar1 = labeled_extract(kem,(ptls_hpke_cipher_suite_t *)0x0,local_f8,
                              (ptls_iovec_t)ZEXT816(0x126371),"eae_prk",dh);
      if (iVar1 == 0) {
        info.len = local_118.off;
        info.base = local_118.base;
        prk.len = kem->hash->digest_size;
        prk.base = local_f8;
        iVar1 = labeled_expand(kem,(ptls_hpke_cipher_suite_t *)0x0,secret,outlen,prk,"shared_secret"
                               ,info);
      }
    }
  }
  ptls_buffer__release_memory(&local_118);
  local_118.off = 0;
  local_118.is_allocated = '\0';
  local_118.align_bits = '\0';
  local_118._26_6_ = 0;
  local_118.base = (uint8_t *)0x0;
  local_118.capacity = 0;
  (*ptls_clear_memory)(local_f8,0x40);
  return iVar1;
}

Assistant:

static int dh_derive(ptls_hpke_kem_t *kem, void *secret, ptls_iovec_t pk_s, ptls_iovec_t pk_r, ptls_iovec_t dh)
{
    return extract_and_expand(kem, secret, kem->hash->digest_size, pk_s, pk_r, dh);
}